

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::
RegisterTests(ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_>_>
  _Var5;
  char *pcVar6;
  _Alloc_hider _Var7;
  char cVar8;
  bool bVar9;
  int iVar10;
  testing *this_00;
  ostream *poVar11;
  size_t sVar12;
  const_iterator cVar13;
  long *plVar14;
  char *pcVar15;
  undefined4 extraout_var;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer pIVar16;
  tuple<const_trust_token_method_st_*,_bool,_int,_bool> *value;
  long lVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  string param_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_suite_name;
  string test_name;
  ParamGenerator<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_> generator;
  GTestLog local_1d8;
  int local_1d4;
  long *local_1d0;
  long *local_1c8;
  pointer local_1c0;
  ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest> *local_1b8;
  char *local_1b0;
  string local_1a8;
  string local_188;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  long local_118;
  char *local_110;
  undefined8 local_108;
  char local_100;
  undefined7 uStack_ff;
  long *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  CodeLocation local_e0;
  pointer local_b8;
  pointer local_b0;
  pointer local_a8;
  ParamNameGeneratorFunc *local_a0;
  char *local_98;
  string local_90;
  CodeLocation local_70;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  local_138 = &local_128;
  local_130 = 0;
  local_128 = 0;
  local_110 = &local_100;
  local_108 = 0;
  local_100 = '\0';
  local_1c0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c0 != local_b8) {
    bVar9 = false;
    local_1b8 = this;
    do {
      pIVar16 = (local_1b8->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = (local_1b8->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar16 != local_b0) {
        do {
          (*pIVar16->generator)(&local_f0);
          sVar2 = (pIVar16->name)._M_string_length;
          local_a0 = pIVar16->name_func;
          local_1b0 = pIVar16->file;
          local_1d4 = pIVar16->line;
          local_a8 = pIVar16;
          if (sVar2 == 0) {
            local_130 = 0;
            *local_138 = 0;
          }
          else {
            local_168._M_impl._0_8_ = &local_168._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar3 = (pIVar16->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)&local_168,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)&local_168);
            std::__cxx11::string::operator=((string *)&local_138,(string *)&local_168);
            if ((_Base_ptr *)local_168._M_impl._0_8_ !=
                &local_168._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_168._M_impl._0_8_,
                              (ulong)((long)&(local_168._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_138,(ulong)(local_1b8->test_suite_name_)._M_dataplus._M_p);
          local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_168._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_168._M_impl.super__Rb_tree_header._M_header;
          local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_168._M_impl.super__Rb_tree_header._M_header._M_right =
               local_168._M_impl.super__Rb_tree_header._M_header._M_left;
          local_1c8 = (long *)(**(code **)(*local_f0 + 0x10))();
          local_1d0 = (long *)(**(code **)(*local_f0 + 0x18))();
          plVar14 = local_1c8;
          if (local_1c8 != local_1d0) {
            local_118 = 0;
            while (cVar8 = (**(code **)(*plVar14 + 0x30))(plVar14,local_1d0), cVar8 == '\0') {
              this_00 = (testing *)(**(code **)(*plVar14 + 0x28))(plVar14);
              local_108 = 0;
              *local_110 = '\0';
              local_1a8.field_2._M_allocated_capacity = *(undefined8 *)(this_00 + 0x10);
              local_1a8._M_dataplus._M_p = *(pointer *)this_00;
              local_1a8._M_string_length = *(size_type *)(this_00 + 8);
              local_1a8.field_2._8_8_ = local_118;
              (*local_a0)(&local_188,
                          (TestParamInfo<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>
                           *)&local_1a8);
              _Var7._M_p = local_188._M_dataplus._M_p;
              if (local_188._M_string_length == 0) {
                bVar9 = false;
              }
              else {
                lVar19 = local_188._M_string_length - 1;
                lVar17 = 0;
                do {
                  uVar18 = (uint)(byte)_Var7._M_p[lVar17];
                  iVar10 = isalnum(uVar18);
                  bVar9 = iVar10 != 0 || uVar18 == 0x5f;
                  if (iVar10 == 0 && uVar18 != 0x5f) break;
                  bVar20 = lVar19 != lVar17;
                  lVar17 = lVar17 + 1;
                } while (bVar20);
              }
              bVar9 = IsTrue(bVar9);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)&local_1a8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_188._M_dataplus._M_p,
                                     local_188._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                pcVar15 = local_1b0;
                if (local_1b0 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
                }
                else {
                  sVar12 = strlen(local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," line ",6);
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_1d4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
                std::ostream::put((char)poVar11);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1a8);
              }
              cVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_168,&local_188);
              bVar9 = IsTrue((_Rb_tree_header *)cVar13._M_node ==
                             &local_168._M_impl.super__Rb_tree_header);
              if (!bVar9) {
                GTestLog::GTestLog((GTestLog *)&local_1a8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_188._M_dataplus._M_p,
                                     local_188._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\', in ",6);
                pcVar15 = local_1b0;
                if (local_1b0 == (char *)0x0) {
                  std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
                }
                else {
                  sVar12 = strlen(local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar11," line ",6);
                plVar14 = (long *)std::ostream::operator<<(poVar11,local_1d4);
                std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
                std::ostream::put((char)plVar14);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1a8);
              }
              peVar4 = (local_1c0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar15 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_110,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar15);
              }
              std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_188._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_168,&local_188);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,local_138,local_138 + local_130);
              pcVar15 = local_110;
              PrintToString<std::tuple<trust_token_method_st_const*,bool,int,bool>>
                        (&local_1a8,this_00,value);
              local_98 = local_1a8._M_dataplus._M_p;
              peVar4 = (local_1c0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_e0.file._M_dataplus._M_p = (pointer)&local_e0.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              local_e0.line = (peVar4->code_location).line;
              iVar10 = (*(local_1b8->super_ParameterizedTestSuiteInfoBase).
                         _vptr_ParameterizedTestSuiteInfoBase[3])();
              bVar9 = IsTrue(true);
              if (!bVar9) {
                GTestLog::GTestLog(&local_1d8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x201);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                           ,0x6a);
                pcVar6 = local_1b0;
                if (local_1b0 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x7047a8);
                }
                else {
                  sVar12 = strlen(local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar6,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,local_1d4);
                GTestLog::~GTestLog(&local_1d8);
              }
              bVar9 = IsTrue(true);
              if (!bVar9) {
                GTestLog::GTestLog(&local_1d8,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x216);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                           ,0x6f);
                pcVar6 = local_1b0;
                if (local_1b0 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x7047a8);
                }
                else {
                  sVar12 = strlen(local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar6,sVar12);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,local_1d4);
                GTestLog::~GTestLog(&local_1d8);
              }
              _Var5.
              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
              ._M_head_impl =
                   (((local_1c0->
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->test_meta_factory)._M_t.
                   super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_>_>
                   .
                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
              ;
              local_38 = *(undefined8 *)(this_00 + 0x10);
              local_48 = *(undefined4 *)this_00;
              uStack_44 = *(undefined4 *)(this_00 + 4);
              uStack_40 = *(undefined4 *)(this_00 + 8);
              uStack_3c = *(undefined4 *)(this_00 + 0xc);
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)_Var5.
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
                                              ._M_head_impl + 0x10))
                                  (_Var5.
                                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_trust_token_method_st_*,_bool,_int,_bool>_>_*,_false>
                                   ._M_head_impl,&local_48);
              MakeAndRegisterTestInfo
                        (&local_90,pcVar15,(char *)0x0,local_98,&local_e0,
                         (TypeId)CONCAT44(extraout_var,iVar10),(SetUpTestSuiteFunc)0x0,
                         (TearDownTestSuiteFunc)0x0,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0.file._M_dataplus._M_p != &local_e0.file.field_2) {
                operator_delete(local_e0.file._M_dataplus._M_p,
                                local_e0.file.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              plVar14 = local_1c8;
              local_118 = local_118 + 1;
              bVar9 = true;
              (**(code **)(*local_1c8 + 0x18))(local_1c8);
            }
          }
          if (local_1d0 != (long *)0x0) {
            (**(code **)(*local_1d0 + 8))(local_1d0);
            plVar14 = local_1c8;
          }
          if (plVar14 != (long *)0x0) {
            (**(code **)(*plVar14 + 8))(plVar14);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_168);
          if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
          }
          pIVar16 = local_a8 + 1;
        } while (pIVar16 != local_b0);
      }
      local_1c0 = local_1c0 + 1;
    } while (local_1c0 != local_b8);
    this = local_1b8;
    if (bVar9) goto LAB_0038ec0d;
  }
  iVar10 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_70.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_70.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_70.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar10),&local_70,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<bssl::(anonymous_namespace)::TrustTokenMetadataTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.file._M_dataplus._M_p,local_70.file.field_2._M_allocated_capacity + 1);
  }
LAB_0038ec0d:
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }